

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeMetric.cpp
# Opt level: O0

bool __thiscall ComputeMetric::Save(ComputeMetric *this,char *out_file,char *date,char *version)

{
  int iVar1;
  FILE *__stream;
  FILE *F;
  bool ret;
  char *version_local;
  char *date_local;
  char *out_file_local;
  ComputeMetric *this_local;
  
  __stream = (FILE *)ithi_file_open(out_file,"w");
  F._7_1_ = __stream != (FILE *)0x0;
  if (F._7_1_) {
    iVar1 = (*this->_vptr_ComputeMetric[6])(this,__stream,date,version);
    F._7_1_ = (bool)((byte)iVar1 & 1);
    fclose(__stream);
  }
  return F._7_1_;
}

Assistant:

bool ComputeMetric::Save(char const * out_file, char const* date, char const* version)
{
    bool ret;
    FILE * F = NULL;
    
    F = ithi_file_open(out_file, "w");
    ret = (F != NULL);

    if (ret)
    {
        ret = Write(F, date, version);
        fclose(F);
    }

    return ret;
}